

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawImageObjectUtil.cpp
# Opt level: O0

void __thiscall
vkt::Draw::Image::upload
          (Image *this,VkQueue queue,Allocator *allocator,VkImageLayout layout,VkOffset3D offset,
          int width,int height,int depth,uint mipLevel,uint arrayElement,
          VkImageAspectFlagBits aspect,VkImageType type,void *data)

{
  DeviceInterface *pDVar1;
  VkDevice device;
  VkCommandBuffer cmdBuffer;
  VkCommandBuffer_s *pVVar2;
  RefData<vk::Handle<(vk::HandleType)24>_> data_00;
  RefData<vk::VkCommandBuffer_s_*> data_01;
  VkExtent3D _extent;
  undefined1 auVar3 [12];
  VkResult VVar4;
  Image *pIVar5;
  Handle<(vk::HandleType)24> *pHVar6;
  VkCommandBuffer_s **ppVVar7;
  VkImage VVar8;
  VkImage VVar9;
  Handle<(vk::HandleType)6> local_350;
  undefined8 uStack_348;
  VkSubmitInfo submitInfo;
  VkImageCopy region;
  undefined1 local_290 [8];
  VkImageMemoryBarrier barrier;
  CmdBufferBeginInfo beginInfo;
  Move<vk::VkCommandBuffer_s_*> local_220;
  RefData<vk::VkCommandBuffer_s_*> local_200;
  undefined1 local_1e0 [8];
  Unique<vk::VkCommandBuffer_s_*> copyCmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_1a0;
  undefined1 local_180 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> copyCmdPool;
  CmdPoolCreateInfo copyCmdPoolCreateInfo;
  VkOffset3D zeroOffset;
  undefined1 local_d8 [8];
  ImageCreateInfo stagingResourceCreateInfo;
  VkExtent3D extent;
  SharedPtr<vkt::Draw::Image> stagingResource;
  VkImageLayout layout_local;
  Allocator *allocator_local;
  VkQueue queue_local;
  Image *this_local;
  VkOffset3D offset_local;
  
  de::SharedPtr<vkt::Draw::Image>::SharedPtr((SharedPtr<vkt::Draw::Image> *)&extent.height);
  stagingResourceCreateInfo.m_queueFamilyIndices.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = width;
  extent.width = depth;
  _extent.height = height;
  _extent.width = width;
  _extent.depth = depth;
  ImageCreateInfo::ImageCreateInfo
            ((ImageCreateInfo *)local_d8,type,this->m_format,_extent,1,1,VK_SAMPLE_COUNT_1_BIT,
             VK_IMAGE_TILING_LINEAR,1,VK_SHARING_MODE_EXCLUSIVE,0,(deUint32 *)0x0,0,
             VK_IMAGE_LAYOUT_UNDEFINED);
  zeroOffset.y = ::vk::MemoryRequirement::HostVisible.m_flags;
  createAndAlloc((Image *)&zeroOffset.z,this->m_vk,this->m_device,(VkImageCreateInfo *)local_d8,
                 allocator,::vk::MemoryRequirement::HostVisible);
  de::SharedPtr<vkt::Draw::Image>::operator=
            ((SharedPtr<vkt::Draw::Image> *)&extent.height,
             (SharedPtr<vkt::Draw::Image> *)&zeroOffset.z);
  de::SharedPtr<vkt::Draw::Image>::~SharedPtr((SharedPtr<vkt::Draw::Image> *)&zeroOffset.z);
  zeroOffset.x = 0;
  pIVar5 = de::SharedPtr<vkt::Draw::Image>::operator->
                     ((SharedPtr<vkt::Draw::Image> *)&extent.height);
  auVar3._4_8_ = 0;
  auVar3._0_4_ = zeroOffset.x;
  uploadLinear(pIVar5,(VkOffset3D)(auVar3 << 0x40),width,height,depth,0,0,aspect,data);
  CmdPoolCreateInfo::CmdPoolCreateInfo
            ((CmdPoolCreateInfo *)
             &copyCmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,
             0,2);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &copyCmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,this->m_vk,
             this->m_device,
             (VkCommandPoolCreateInfo *)
             &copyCmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_1a0,
             (Move *)&copyCmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_1a0.deleter.m_deviceIface;
  data_00.object.m_internal = local_1a0.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_1a0.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device._0_4_ = (int)local_1a0.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_1a0.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator._0_4_ = (int)local_1a0.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_1a0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_180,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &copyCmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pDVar1 = this->m_vk;
  device = this->m_device;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_180);
  ::vk::allocateCommandBuffer
            (&local_220,pDVar1,device,(VkCommandPool)pHVar6->m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_200,(Move *)&local_220);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_200.deleter.m_deviceIface;
  data_01.object = local_200.object;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_200.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device._0_4_ = (int)local_200.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_200.deleter.m_device >> 0x20);
  data_01.deleter.m_pool.m_internal._0_4_ = (int)local_200.deleter.m_pool.m_internal;
  data_01.deleter.m_pool.m_internal._4_4_ = (int)(local_200.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_1e0,data_01);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_220);
  CmdBufferBeginInfo::CmdBufferBeginInfo
            ((CmdBufferBeginInfo *)&barrier.subresourceRange.layerCount,0);
  pDVar1 = this->m_vk;
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_1e0);
  VVar4 = (*pDVar1->_vptr_DeviceInterface[0x49])
                    (pDVar1,*ppVVar7,&barrier.subresourceRange.layerCount);
  ::vk::checkResult(VVar4,"m_vk.beginCommandBuffer(*copyCmdBuffer, &beginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawImageObjectUtil.cpp"
                    ,0x243);
  stagingResource.m_state._4_4_ = layout;
  if (layout == VK_IMAGE_LAYOUT_UNDEFINED) {
    stagingResource.m_state._4_4_ = VK_IMAGE_LAYOUT_GENERAL;
    ::vk::VkImageMemoryBarrier::VkImageMemoryBarrier((VkImageMemoryBarrier *)local_290);
    local_290._0_4_ = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
    barrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    barrier._4_4_ = 0;
    barrier.pNext._0_4_ = 0;
    barrier.pNext._4_4_ = 0;
    barrier.srcAccessMask = 0;
    barrier.dstAccessMask = 1;
    barrier.oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
    barrier.newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
    barrier._32_8_ = object(this);
    barrier.image.m_internal._0_4_ = aspect;
    barrier.image.m_internal._4_4_ = 0;
    barrier.subresourceRange.aspectMask = this->m_levelCount;
    barrier.subresourceRange.baseMipLevel = 0;
    barrier.subresourceRange.levelCount = this->m_layerCount;
    pDVar1 = this->m_vk;
    ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                        ((RefBase<vk::VkCommandBuffer_s_*> *)local_1e0);
    (*pDVar1->_vptr_DeviceInterface[0x6d])(pDVar1,*ppVVar7,0x8000,1);
  }
  pDVar1 = this->m_vk;
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_1e0);
  cmdBuffer = *ppVVar7;
  pIVar5 = de::SharedPtr<vkt::Draw::Image>::operator->
                     ((SharedPtr<vkt::Draw::Image> *)&extent.height);
  VVar8 = object(pIVar5);
  transition2DImage(pDVar1,cmdBuffer,VVar8,aspect,VK_IMAGE_LAYOUT_UNDEFINED,VK_IMAGE_LAYOUT_GENERAL,
                    0,0);
  pDVar1 = this->m_vk;
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_1e0);
  pVVar2 = *ppVVar7;
  pIVar5 = de::SharedPtr<vkt::Draw::Image>::operator->
                     ((SharedPtr<vkt::Draw::Image> *)&extent.height);
  VVar8 = object(pIVar5);
  VVar9 = object(this);
  (*pDVar1->_vptr_DeviceInterface[0x60])
            (pDVar1,pVVar2,VVar8.m_internal,1,VVar9.m_internal,(ulong)stagingResource.m_state._4_4_)
  ;
  pDVar1 = this->m_vk;
  ppVVar7 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_1e0);
  VVar4 = (*pDVar1->_vptr_DeviceInterface[0x4a])(pDVar1,*ppVVar7);
  ::vk::checkResult(VVar4,"m_vk.endCommandBuffer(*copyCmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawImageObjectUtil.cpp"
                    ,0x26a);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_348 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 ((RefBase<vk::VkCommandBuffer_s_*> *)local_1e0);
  pDVar1 = this->m_vk;
  ::vk::Handle<(vk::HandleType)6>::Handle(&local_350,0);
  (*pDVar1->_vptr_DeviceInterface[2])(pDVar1,queue,1,&uStack_348,local_350.m_internal);
  VVar4 = (*this->m_vk->_vptr_DeviceInterface[3])(this->m_vk,queue);
  ::vk::checkResult(VVar4,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawImageObjectUtil.cpp"
                    ,0x27b);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_1e0);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_180);
  ImageCreateInfo::~ImageCreateInfo((ImageCreateInfo *)local_d8);
  de::SharedPtr<vkt::Draw::Image>::~SharedPtr((SharedPtr<vkt::Draw::Image> *)&extent.height);
  return;
}

Assistant:

void Image::upload (vk::VkQueue					queue,
					vk::Allocator&				allocator,
					vk::VkImageLayout			layout,
					vk::VkOffset3D				offset,
					int							width,
					int							height,
					int							depth,
					unsigned int				mipLevel,
					unsigned int				arrayElement,
					vk::VkImageAspectFlagBits	aspect,
					vk::VkImageType				type,
					const void *				data)
{
	DE_ASSERT(layout == vk::VK_IMAGE_LAYOUT_GENERAL || layout == vk::VK_IMAGE_LAYOUT_UNDEFINED || layout == vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL);

	de::SharedPtr<Image> stagingResource;
	vk::VkExtent3D extent = {(deUint32)width, (deUint32)height, (deUint32)depth};
	ImageCreateInfo stagingResourceCreateInfo(
		type, m_format, extent, 1, 1, vk::VK_SAMPLE_COUNT_1_BIT,
		vk::VK_IMAGE_TILING_LINEAR, vk::VK_IMAGE_USAGE_TRANSFER_SRC_BIT);

	stagingResource = Image::createAndAlloc(m_vk, m_device, stagingResourceCreateInfo, allocator,
								vk::MemoryRequirement::HostVisible);

	const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
	stagingResource->uploadLinear(zeroOffset, width, height, depth, 0, 0, aspect, data);

	{
		//todo [scygan] get proper queueFamilyIndex
		CmdPoolCreateInfo copyCmdPoolCreateInfo(0);
		vk::Unique<vk::VkCommandPool> copyCmdPool(vk::createCommandPool(m_vk, m_device, &copyCmdPoolCreateInfo));
		vk::Unique<vk::VkCommandBuffer> copyCmdBuffer(vk::allocateCommandBuffer(m_vk, m_device, *copyCmdPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));

		CmdBufferBeginInfo beginInfo;
		VK_CHECK(m_vk.beginCommandBuffer(*copyCmdBuffer, &beginInfo));

		if (layout == vk::VK_IMAGE_LAYOUT_UNDEFINED)
		{
			layout = vk::VK_IMAGE_LAYOUT_GENERAL;

			vk::VkImageMemoryBarrier barrier;
			barrier.sType = vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
			barrier.pNext = DE_NULL;
			barrier.srcAccessMask = 0;
			barrier.dstAccessMask = 0;
			barrier.oldLayout = vk::VK_IMAGE_LAYOUT_UNDEFINED;
			barrier.newLayout = vk::VK_IMAGE_LAYOUT_GENERAL;
			barrier.srcQueueFamilyIndex = VK_QUEUE_FAMILY_IGNORED;
			barrier.dstQueueFamilyIndex = VK_QUEUE_FAMILY_IGNORED;
			barrier.image = object();

			barrier.subresourceRange.aspectMask = aspect;
			barrier.subresourceRange.baseMipLevel = 0;
			barrier.subresourceRange.levelCount = m_levelCount;
			barrier.subresourceRange.baseArrayLayer = 0;
			barrier.subresourceRange.layerCount = m_layerCount;

			m_vk.cmdPipelineBarrier(*copyCmdBuffer, vk::VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, vk::VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (vk::VkDependencyFlags)0,
									0, (const vk::VkMemoryBarrier*)DE_NULL,
									0, (const vk::VkBufferMemoryBarrier*)DE_NULL,
									1, &barrier);
		}

		transition2DImage(m_vk, *copyCmdBuffer, stagingResource->object(), aspect, vk::VK_IMAGE_LAYOUT_UNDEFINED, vk::VK_IMAGE_LAYOUT_GENERAL);

		vk::VkImageCopy region = {{ (vk::VkImageAspectFlags)aspect, 0, 0, 1},
									zeroOffset,
									{ (vk::VkImageAspectFlags)aspect, mipLevel, arrayElement, 1},
									offset,
									{(deUint32)width, (deUint32)height, (deUint32)depth}};

		m_vk.cmdCopyImage(*copyCmdBuffer, stagingResource->object(),
								vk::VK_IMAGE_LAYOUT_GENERAL, object(), layout, 1, &region);
		VK_CHECK(m_vk.endCommandBuffer(*copyCmdBuffer));

		vk::VkSubmitInfo submitInfo =
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
			DE_NULL,							// const void*				pNext;
			0,									// deUint32					waitSemaphoreCount;
			DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1,									// deUint32					commandBufferCount;
			&copyCmdBuffer.get(),				// const VkCommandBuffer*	pCommandBuffers;
			0,									// deUint32					signalSemaphoreCount;
			DE_NULL								// const VkSemaphore*		pSignalSemaphores;
		};
		m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL);

		// TODO: make this less intrusive
		VK_CHECK(m_vk.queueWaitIdle(queue));
	}
}